

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imu-elastic-local-frame-dynamical-system.cpp
# Opt level: O0

void __thiscall
stateObservation::flexibilityEstimation::IMUElasticLocalFrameDynamicalSystem::
computeElastPendulumForcesAndMoments1
          (IMUElasticLocalFrameDynamicalSystem *this,IndexedMatrixArray *PrArray,Vector3 *position,
          Vector3 *linVelocity,Vector3 *oriVector,Matrix3 *orientation,Vector3 *angVel,
          Vector *forces,Vector *moments)

{
  uint uVar1;
  Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0> PVar2;
  Type local_3e0;
  Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false> *local_3b0;
  NegativeReturnType local_3a8;
  Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>
  local_398;
  Type local_380;
  Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false> *local_350;
  NegativeReturnType local_348;
  Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>
  local_338;
  Type local_320;
  Matrix<double,_3,_1,_0,_3,_1> *local_2f0;
  Matrix3 local_2e8;
  Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> local_2a0;
  Type local_290;
  Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> local_260;
  Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> local_250;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
  local_240;
  double local_218;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>_>
  local_210;
  Matrix<double,__1,__1,_0,__1,__1> local_1c8;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
  local_1b0;
  Matrix<double,_3,_1,_0,_3,_1> *local_198;
  Matrix<double,__1,__1,_0,__1,__1> local_190;
  MatrixBase<Eigen::Matrix<double,3,3,0,3,3>> local_178 [72];
  Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> local_130;
  Product<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>
  local_120;
  Matrix<double,_3,_1,_0,_3,_1> *local_108;
  Matrix<double,_3,_1,_0,_3,_1> *local_100 [3];
  Matrix<double,__1,__1,_0,__1,__1> local_e8;
  Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>
  local_d0;
  uint local_bc;
  double dStack_b8;
  uint i;
  double lengthRate;
  double modifiedRopeLength;
  double ropeLength;
  Vector3 du;
  Vector3 u;
  Vector3 momenti;
  Vector3 forcei;
  uint nbContacts;
  Matrix3 *orientation_local;
  Vector3 *oriVector_local;
  Vector3 *linVelocity_local;
  Vector3 *position_local;
  IndexedMatrixArray *PrArray_local;
  IMUElasticLocalFrameDynamicalSystem *this_local;
  
  uVar1 = getContactsNumber(this);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setZero
            ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)forces);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setZero
            ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)moments);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
            ((Matrix<double,_3,_1,_0,_3,_1> *)
             (momenti.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 2));
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
            ((Matrix<double,_3,_1,_0,_3,_1> *)
             (u.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
             + 2));
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
            ((Matrix<double,_3,_1,_0,_3,_1> *)
             (du.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
             + 2));
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix((Matrix<double,_3,_1,_0,_3,_1> *)&ropeLength);
  for (local_bc = 0; local_bc < uVar1; local_bc = local_bc + 1) {
    Eigen::Matrix<double,_3,_1,_0,_3,_1>::operator=
              ((Matrix<double,_3,_1,_0,_3,_1> *)
               (du.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                array + 2),position);
    IndexedMatrixArray::operator[]((Matrix *)&local_e8,PrArray,local_bc);
    PVar2 = Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
                      ((MatrixBase<Eigen::Matrix<double,3,3,0,3,3>> *)orientation,
                       (MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_e8);
    local_d0 = PVar2;
    local_100[0] = (Matrix<double,_3,_1,_0,_3,_1> *)
                   Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::noalias
                             ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                              (du.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                               m_storage.m_data.array + 2));
    Eigen::NoAlias<Eigen::Matrix<double,3,1,0,3,1>,Eigen::MatrixBase>::operator+=
              ((NoAlias<Eigen::Matrix<double,3,1,0,3,1>,Eigen::MatrixBase> *)local_100,
               (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>
                *)&local_d0);
    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_e8);
    local_108 = (Matrix<double,_3,_1,_0,_3,_1> *)
                Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::noalias
                          ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                           (du.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                            m_storage.m_data.array + 2));
    Eigen::NoAlias<Eigen::Matrix<double,3,1,0,3,1>,Eigen::MatrixBase>::operator-=
              ((NoAlias<Eigen::Matrix<double,3,1,0,3,1>,Eigen::MatrixBase> *)&local_108,
               (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&this->pe);
    Eigen::Matrix<double,_3,_1,_0,_3,_1>::operator=
              ((Matrix<double,_3,_1,_0,_3,_1> *)&ropeLength,linVelocity);
    kine::skewSymmetric((Matrix3 *)local_178,angVel);
    local_130 = Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
                          (local_178,
                           (MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)orientation);
    IndexedMatrixArray::operator[]((Matrix *)&local_190,PrArray,local_bc);
    Eigen::
    MatrixBase<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,3,0,3,3>,0>>::
    operator*(&local_120,
              (MatrixBase<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,3,0,3,3>,0>>
               *)&local_130,(MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_190);
    local_198 = (Matrix<double,_3,_1,_0,_3,_1> *)
                Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::noalias
                          ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&ropeLength);
    Eigen::NoAlias<Eigen::Matrix<double,3,1,0,3,1>,Eigen::MatrixBase>::operator+=
              ((NoAlias<Eigen::Matrix<double,3,1,0,3,1>,Eigen::MatrixBase> *)&local_198,
               (MatrixBase<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>
                *)&local_120);
    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_190);
    IndexedMatrixArray::operator[]((Matrix *)&local_1c8,PrArray,local_bc);
    Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator-
              (&local_1b0,(MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_1c8,
               (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&this->pe);
    modifiedRopeLength =
         Eigen::
         MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
         ::norm((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                 *)&local_1b0);
    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_1c8);
    lengthRate = Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::norm
                           ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                            (du.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                             m_storage.m_data.array + 2));
    dStack_b8 = (lengthRate - modifiedRopeLength) / lengthRate;
    local_218 = -dStack_b8;
    local_250 = Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
                          ((MatrixBase<Eigen::Matrix<double,3,3,0,3,3>> *)&this->KfeRopes_,
                           (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                           (du.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                            m_storage.m_data.array + 2));
    local_260 = Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
                          ((MatrixBase<Eigen::Matrix<double,3,3,0,3,3>> *)&this->KfvRopes_,
                           (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&ropeLength);
    Eigen::
    MatrixBase<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,1,0,3,1>,0>>::
    operator+(&local_240,
              (MatrixBase<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,1,0,3,1>,0>>
               *)&local_250,
              (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
               *)&local_260);
    Eigen::operator*(&local_210,&local_218,(StorageBaseType *)&local_240);
    Eigen::Matrix<double,3,1,0,3,1>::operator=
              ((Matrix<double,3,1,0,3,1> *)
               (momenti.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                m_data.array + 2),
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>_>_>
                *)&local_210);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<3>
              (&local_290,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)forces,0,3);
    Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>,3,1,false>>::operator+=
              ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,3,1,false>> *)&local_290,
               (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
               (momenti.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                m_data.array + 2));
    kine::skewSymmetric(&local_2e8,
                        (Vector3 *)
                        (du.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                         m_data.array + 2));
    local_2a0 = Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
                          ((MatrixBase<Eigen::Matrix<double,3,3,0,3,3>> *)&local_2e8,
                           (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                           (momenti.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                            m_storage.m_data.array + 2));
    local_2f0 = (Matrix<double,_3,_1,_0,_3,_1> *)
                Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::noalias
                          ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                           (u.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
                            .m_data.array + 2));
    Eigen::NoAlias<Eigen::Matrix<double,3,1,0,3,1>,Eigen::MatrixBase>::operator=
              ((NoAlias<Eigen::Matrix<double,3,1,0,3,1>,Eigen::MatrixBase> *)&local_2f0,
               (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
                *)&local_2a0);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<3>
              (&local_320,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)moments,0,3);
    Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>,3,1,false>>::operator+=
              ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,3,1,false>> *)&local_320,
               (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
               (u.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                array + 2));
  }
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator-
            (&local_348,(DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)&this->KteRopes_);
  Eigen::
  MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>>
  ::operator*(&local_338,
              (MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>>
               *)&local_348,(MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)oriVector);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<3>
            (&local_380,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)moments,0,3);
  local_350 = (Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false> *)
              Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_3,_1,_false>_>
              ::noalias((MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>_>
                         *)&local_380);
  Eigen::NoAlias<Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>,3,1,false>,Eigen::MatrixBase>::
  operator+=((NoAlias<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,3,1,false>,Eigen::MatrixBase> *
             )&local_350,
             (MatrixBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
              *)&local_338);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator-
            (&local_3a8,(DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)&this->KtvRopes_);
  Eigen::
  MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>>
  ::operator*(&local_398,
              (MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>>
               *)&local_3a8,(MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)angVel);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<3>
            (&local_3e0,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)moments,0,3);
  local_3b0 = (Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false> *)
              Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_3,_1,_false>_>
              ::noalias((MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>_>
                         *)&local_3e0);
  Eigen::NoAlias<Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>,3,1,false>,Eigen::MatrixBase>::
  operator+=((NoAlias<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,3,1,false>,Eigen::MatrixBase> *
             )&local_3b0,
             (MatrixBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
              *)&local_398);
  if ((this->printed_ & 1U) == 0) {
    this->printed_ = true;
  }
  return;
}

Assistant:

void IMUElasticLocalFrameDynamicalSystem::computeElastPendulumForcesAndMoments1
                              (const IndexedMatrixArray& PrArray,
                               const Vector3& position, const Vector3& linVelocity,
                               const Vector3& oriVector, const Matrix3& orientation,
                               const Vector3& angVel,
                               Vector& forces, Vector& moments)
    {
        unsigned nbContacts(getContactsNumber());
        forces.setZero(); moments.setZero();

        stateObservation::Vector3 forcei;
        stateObservation::Vector3 momenti;
        stateObservation::Vector3 u, du;

        double ropeLength;
        double modifiedRopeLength;
        double lengthRate;

        for (unsigned i = 0; i<nbContacts ; ++i)
        {
            u = position;
            u.noalias() += orientation*PrArray[i] ;
            u.noalias() -= pe;

            du = linVelocity;
            du.noalias() += kine::skewSymmetric(angVel)*orientation*PrArray[i] ;

            ropeLength=(PrArray[i]-pe).norm();
            modifiedRopeLength=u.norm();

            lengthRate=(modifiedRopeLength-ropeLength)/modifiedRopeLength;

            forcei = -lengthRate*(KfeRopes_*u+KfvRopes_*du);
            forces.segment<3>(0) += forcei;

            momenti.noalias() = kine::skewSymmetric(u)*forcei;
            moments.segment<3>(0) += momenti;
        }

        moments.segment<3>(0).noalias() += - KteRopes_*oriVector;
        moments.segment<3>(0).noalias() += - KtvRopes_*angVel;

        if(printed_==false)
        {
    //            std::cout << "ropeLength=" << ropeLength << std::endl;
    //        std::cout << "modifiedRopeLength=" << modifiedRopeLength << std::endl;
    //            std::cout << "contactOriUnitVector=" << contactOriUnitVector.transpose() << std::endl;
    //            std::cout << "forcei=" << forcei.transpose() << std::endl;
    //            std::cout << "momenti=" << momenti.transpose() << std::endl;
            printed_=true;
        }

    }